

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall mp::NLFeeder_Easy::FillColSizes(NLFeeder_Easy *this)

{
  NLModel *this_00;
  reference pvVar1;
  NLFeeder_Easy *in_RDI;
  size_t pos;
  NLW2_SparseMatrix_C A;
  NLModel *in_stack_ffffffffffffffc0;
  size_type local_38;
  size_type in_stack_ffffffffffffffd8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffe0;
  long local_18;
  
  NLME(in_RDI);
  NLModel::GetA(in_stack_ffffffffffffffc0);
  this_00 = NLME(in_RDI);
  NLModel::NumCols(this_00);
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  local_38 = in_stack_ffffffffffffffd8;
  while (local_38 != 0) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RDI->col_sizes_,(long)*(int *)(local_18 + (local_38 - 1) * 4));
    *pvVar1 = *pvVar1 + 1;
    local_38 = local_38 - 1;
  }
  return;
}

Assistant:

void FillColSizes() {
    auto A = NLME().GetA();
    col_sizes_.resize(NLME().NumCols());
    for (auto pos=A.num_nz_; pos--; )
      ++col_sizes_[A.index_[pos]];
  }